

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall google::protobuf::MessageLite::AppendToString(MessageLite *this,string *output)

{
  int iVar1;
  LogMessage *pLVar2;
  MessageLite *message;
  LogFinisher local_79;
  string local_78;
  LogMessage local_58;
  
  iVar1 = (*this->_vptr_MessageLite[5])();
  if ((char)iVar1 == '\0') {
    message = (MessageLite *)0x111;
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x111);
    pLVar2 = internal::LogMessage::operator<<(&local_58,"CHECK failed: IsInitialized(): ");
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)"serialize",(char *)this,message);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,&local_78);
    internal::LogFinisher::operator=(&local_79,pLVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char)iVar1 == '\0') {
    internal::LogMessage::~LogMessage(&local_58);
  }
  AppendPartialToString(this,output);
  return true;
}

Assistant:

bool MessageLite::AppendToString(string* output) const {
  GOOGLE_DCHECK(IsInitialized()) << InitializationErrorMessage("serialize", *this);
  return AppendPartialToString(output);
}